

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O2

void __thiscall TcpConn::OnData(TcpConn *this)

{
  Buffer *this_00;
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  ssize_t sVar5;
  undefined4 extraout_var_00;
  ostream *poVar6;
  int *piVar7;
  size_t in_RCX;
  long lStack_40;
  BufferChain *this_01;
  
  iVar2 = (*(this->super_PollObj)._vptr_PollObj[9])();
  this_01 = (BufferChain *)CONCAT44(extraout_var,iVar2);
  this_00 = &this->super_Buffer;
  do {
    pcVar4 = BufferChain::GetWriteAddr(this_01);
    uVar1 = BufferChain::GetCanWriteCount(this_01);
    sVar5 = TcpSocket::read(&this->m_socket,(int)pcVar4,(void *)(ulong)uVar1,in_RCX);
    iVar2 = (int)sVar5;
    if (iVar2 < 0) {
      Buffer::AddReaChain(this_00,this_01);
      piVar7 = __errno_location();
      if (*piVar7 == 0xb) {
        TmpSend(this);
        lStack_40 = 0x38;
      }
      else {
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
        poVar6 = std::operator<<(poVar6,":");
        iVar2 = *piVar7;
LAB_001052fd:
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
        std::endl<char,std::char_traits<char>>(poVar6);
        lStack_40 = 0x40;
      }
      (**(code **)((long)(this->super_PollObj)._vptr_PollObj + lStack_40))(this);
      return;
    }
    if (iVar2 == 0) {
      Buffer::AddReaChain(this_00,this_01);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
      poVar6 = std::operator<<(poVar6,":");
      piVar7 = __errno_location();
      iVar2 = *piVar7;
      goto LAB_001052fd;
    }
    this_01->write = this_01->write + (short)sVar5;
    uVar1 = BufferChain::GetCanWriteCount(this_01);
    if (uVar1 == 0) {
      Buffer::AddReaChain(this_00,this_01);
      iVar3 = (*(this->super_PollObj)._vptr_PollObj[9])(this);
      this_01 = (BufferChain *)CONCAT44(extraout_var_00,iVar3);
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"read ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
    std::endl<char,std::char_traits<char>>(poVar6);
  } while( true );
}

Assistant:

void TcpConn::OnData()
{
    BufferChain* buff = this->Alloc();
    while (true)
    {    
        //TODO最后一次内存泄漏
        //既然用了et 这里要改 要一次性读完
        int ret = m_socket.read(buff->GetWriteAddr(), buff->GetCanWriteCount());
        if(ret < 0)
        {
            this->AddReaChain(buff);
            if(errno == EAGAIN || errno == EWOULDBLOCK)
            {
                break;
            }
            else
            {
                std::cout << ret << ":" << errno << std::endl;
                this->OnConnError();
                return;
            }
        }
        else if(ret == 0)
        {
            this->AddReaChain(buff);
            std::cout << ret << ":" << errno << std::endl;
            this->OnConnError();
            return;
        }
        buff->write += ret;
        if(buff->GetCanWriteCount() == 0)
        {
            this->AddReaChain(buff);
            buff = this->Alloc();
        }
        std::cout << "read " << ret << std::endl;

    }

    this->TmpSend();
    this->OnConnData();
}